

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall TPZFMatrix<long>::TPZFMatrix(TPZFMatrix<long> *this,TPZFMatrix<long> *A)

{
  long in_RSI;
  TPZManVector<int,_5> *in_RDI;
  TPZManVector<int,_5> *unaff_retaddr;
  void **in_stack_ffffffffffffffd8;
  TPZManVector<int,_5> *copy;
  TPZVec<long> *in_stack_ffffffffffffffe0;
  TPZManVector<int,_5> *copy_00;
  
  copy_00 = in_RDI;
  TPZMatrix<long>::TPZMatrix
            ((TPZMatrix<long> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (TPZMatrix<long> *)in_RDI);
  (((TPZBaseMatrix *)&in_RDI->super_TPZVec<int>)->super_TPZSavable)._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_023f35c8;
  *(undefined8 *)in_RDI->fExtAlloc = *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)(in_RDI->fExtAlloc + 2) = *(undefined8 *)(in_RSI + 0x28);
  *(undefined8 *)(in_RDI->fExtAlloc + 4) = *(undefined8 *)(in_RSI + 0x30);
  copy = in_RDI + 1;
  TPZManVector<int,_5>::TPZManVector(unaff_retaddr,copy_00);
  TPZVec<long>::TPZVec(in_stack_ffffffffffffffe0,(TPZVec<long> *)copy);
  *(undefined8 *)(in_RSI + 0x20) = 0;
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(TPZFMatrix<TVar> &&A)
    : TPZMatrix<TVar>(A), fElem(A.fElem),
      fGiven(A.fGiven),fSize(A.fSize),
      fPivot(A.fPivot), fWork(A.fWork)
{
    A.fElem=nullptr;
    A.fGiven=nullptr;
    A.fSize=0;
}